

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsXYZROTnode.cpp
# Opt level: O2

shared_ptr<chrono::fea::ChNodeFEAxyzrot> __thiscall
chrono::fea::ChLoadXYZROTnodeXYZROTnode::GetNodeA(ChLoadXYZROTnodeXYZROTnode *this)

{
  shared_ptr<chrono::fea::ChNodeFEAxyzrot> sVar1;
  
  sVar1 = std::dynamic_pointer_cast<chrono::fea::ChNodeFEAxyzrot,chrono::ChLoadable>
                    ((shared_ptr<chrono::ChLoadable> *)this);
  sVar1.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<chrono::fea::ChNodeFEAxyzrot>)
         sVar1.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ChNodeFEAxyzrot> ChLoadXYZROTnodeXYZROTnode::GetNodeA() const {
    return std::dynamic_pointer_cast<ChNodeFEAxyzrot>(this->loadables[0]);
}